

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall xmrig::Console::Console(Console *this,IConsoleListener *listener)

{
  bool bVar1;
  int iVar2;
  uv_tty_t *puVar3;
  undefined8 uVar4;
  
  this->m_buf[0] = '\0';
  this->m_listener = listener;
  this->m_tty = (uv_tty_t *)0x0;
  bVar1 = isSupported(this);
  if (bVar1) {
    puVar3 = (uv_tty_t *)operator_new(0x138);
    this->m_tty = puVar3;
    puVar3->data = this;
    uVar4 = uv_default_loop();
    uv_tty_init(uVar4,this->m_tty,0,1);
    iVar2 = uv_is_readable(this->m_tty);
    if (iVar2 != 0) {
      uv_tty_set_mode(this->m_tty,1);
      uv_read_start(this->m_tty,onAllocBuffer,onRead);
      return;
    }
  }
  return;
}

Assistant:

xmrig::Console::Console(IConsoleListener *listener)
    : m_listener(listener)
{
    if (!isSupported()) {
        return;
    }

    m_tty = new uv_tty_t;
    m_tty->data = this;
    uv_tty_init(uv_default_loop(), m_tty, 0, 1);

    if (!uv_is_readable(reinterpret_cast<uv_stream_t*>(m_tty))) {
        return;
    }

    uv_tty_set_mode(m_tty, UV_TTY_MODE_RAW);
    uv_read_start(reinterpret_cast<uv_stream_t*>(m_tty), Console::onAllocBuffer, Console::onRead);
}